

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O3

Image<float,_gimage::PixelTraits<float>_> *
gimage::medianDownscaleImage<float>
          (Image<float,_gimage::PixelTraits<float>_> *__return_storage_ptr__,
          Image<float,_gimage::PixelTraits<float>_> *image,int factor)

{
  long lVar1;
  long lVar2;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  uint uVar3;
  float ***pppfVar4;
  pointer __first;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int ii;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  vector<float,_std::allocator<float>_> v;
  allocator_type local_81;
  long local_80;
  Image<float,_gimage::PixelTraits<float>_> *local_78;
  ulong local_70;
  ulong local_68;
  Image<float,_gimage::PixelTraits<float>_> *local_60;
  value_type_conflict2 local_54;
  ulong local_50;
  vector<float,_std::allocator<float>_> local_48;
  
  uVar14 = 1;
  if (1 < factor) {
    uVar14 = (ulong)(uint)factor;
  }
  lVar7 = image->width;
  lVar9 = image->height;
  iVar8 = image->depth;
  __return_storage_ptr__->depth = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->pixel = (float *)0x0;
  __return_storage_ptr__->row = (float **)0x0;
  __return_storage_ptr__->img = (float ***)0x0;
  local_78 = __return_storage_ptr__;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (__return_storage_ptr__,(long)(lVar7 + (uVar14 - 1)) / (long)uVar14,
             (long)((uVar14 - 1) + lVar9) / (long)uVar14,(long)iVar8);
  local_54 = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_48,(ulong)(uint)((int)uVar14 * (int)uVar14),&local_54,&local_81);
  iVar8 = image->depth;
  if (0 < iVar8) {
    lVar7 = image->height;
    local_80 = 0;
    local_60 = image;
    do {
      if (0 < lVar7) {
        lVar9 = image->width;
        local_70 = 0;
        do {
          if (0 < lVar9) {
            local_50 = local_70 / uVar14;
            uVar11 = 0;
            do {
              __first = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar7 = image->height;
              uVar10 = 0;
              uVar13 = 0;
              do {
                lVar1 = local_70 + uVar10;
                if (lVar7 <= lVar1) break;
                uVar3 = local_60->depth;
                pppfVar4 = local_60->img;
                uVar12 = 0;
                do {
                  lVar2 = uVar12 + uVar11;
                  if (lVar9 <= lVar2) break;
                  if ((int)uVar3 < 1) {
LAB_0012cf85:
                    local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar13] = pppfVar4[local_80][lVar1][lVar2]
                    ;
                    uVar13 = uVar13 + 1;
                  }
                  else if ((uint)ABS((*pppfVar4)[lVar1][lVar2]) < 0x7f800000) {
                    uVar5 = 1;
                    do {
                      uVar6 = uVar5;
                      if (uVar3 == uVar6) break;
                      uVar5 = uVar6 + 1;
                    } while ((uint)ABS(pppfVar4[uVar6][lVar1][lVar2]) < 0x7f800000);
                    if (uVar3 <= uVar6) goto LAB_0012cf85;
                  }
                  uVar12 = uVar12 + 1;
                } while (uVar12 != uVar14);
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar14);
              local_68 = uVar11 / uVar14;
              local_78->img[local_80][local_50][local_68] = INFINITY;
              if (0 < (int)uVar13) {
                __last._M_current =
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + (uVar13 >> 1);
                std::
                __heap_select<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,__last._M_current,
                           local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar13);
                std::
                __sort_heap<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                           __first,__last,(_Iter_less_iter *)&local_54);
                local_78->img[local_80][local_50][local_68] =
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar13 >> 1];
                lVar9 = local_60->width;
              }
              uVar11 = uVar11 + uVar14;
              image = local_60;
            } while ((long)uVar11 < lVar9);
            lVar7 = local_60->height;
          }
          local_70 = local_70 + uVar14;
        } while ((long)local_70 < lVar7);
        iVar8 = image->depth;
      }
      local_80 = local_80 + 1;
    } while (local_80 < iVar8);
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_78;
}

Assistant:

Image<T> medianDownscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  std::vector<T> v(factor*factor, 0);

  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k+=factor)
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        int n=0;

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValid(i+ii, k+kk))
            {
              v[n]=image.get(i+ii, k+kk, d);
              n++;
            }
          }
        }

        ret.setInvalid(i/factor, k/factor, d);

        if (n > 0)
        {
          partial_sort(v.begin(), v.begin()+(n>>1), v.begin()+n);
          ret.set(i/factor, k/factor, d, v[n>>1]);
        }
      }
    }
  }

  return ret;
}